

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::setSelection(QLineEdit *this,int start,int length)

{
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar1;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  QStyleOptionFrame opt;
  undefined1 local_78 [32];
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < start) {
    this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
    if (start <= (int)(this_00->control->m_text).d.size) {
      QWidgetLineControl::setSelection((QWidgetLineControl *)this_00->control,start,length);
      pQVar1 = this_00->control;
      if (((pQVar1->m_text).d.size != 0) && (pQVar1->m_selstart < pQVar1->m_selend)) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._16_4_ = -0x55555556;
        local_78._20_4_ = -0x55555556;
        local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_4_ = -0x55555556;
        local_78._4_4_ = -0x55555556;
        local_78._8_4_ = 0xaaaaaaaa;
        local_78._12_4_ = 0xaaaaaaaa;
        QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_78);
        (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,local_78);
        pQVar3 = QWidget::style(&this->super_QWidget);
        iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x1c,local_78,this,0);
        if (iVar2 == 0) {
          QLineEditPrivate::setCursorVisible(this_00,false);
        }
        QStyleOption::~QStyleOption((QStyleOption *)local_78);
      }
      goto LAB_00418ccf;
    }
  }
  local_78._0_4_ = 2;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = LeftToRight;
  local_78._16_4_ = 0;
  local_78._20_4_ = 0;
  local_78._24_8_ = "default";
  QMessageLogger::warning(local_78,"QLineEdit::setSelection: Invalid start position (%d)",start);
LAB_00418ccf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setSelection(int start, int length)
{
    Q_D(QLineEdit);
    if (Q_UNLIKELY(start < 0 || start > (int)d->control->end())) {
        qWarning("QLineEdit::setSelection: Invalid start position (%d)", start);
        return;
    }

    d->control->setSelection(start, length);

    if (d->control->hasSelectedText()){
        QStyleOptionFrame opt;
        initStyleOption(&opt);
        if (!style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, this))
            d->setCursorVisible(false);
    }
}